

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O3

ValuedAction despot::AEMS::OptimalAction(VNode *vnode)

{
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar1;
  QNode *this;
  ulong uVar2;
  double dVar3;
  ValuedAction VVar4;
  ValuedAction astar;
  ValuedAction local_48;
  ValuedAction local_30;
  
  ValuedAction::ValuedAction(&local_48,-1,-INFINITY);
  pvVar1 = VNode::children(vnode);
  if ((pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      this = VNode::Child(vnode,(ACT_TYPE)uVar2);
      dVar3 = QNode::lower_bound(this);
      if (local_48.value < dVar3) {
        dVar3 = QNode::lower_bound(this);
        ValuedAction::ValuedAction(&local_30,(ACT_TYPE)uVar2,dVar3);
        local_48.action = local_30.action;
        local_48._4_4_ = local_30._4_4_;
        local_48.value = local_30.value;
      }
      uVar2 = uVar2 + 1;
      pvVar1 = VNode::children(vnode);
    } while (uVar2 < (ulong)((long)(pvVar1->
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar1->
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  VVar4._0_8_ = local_48._0_8_ & 0xffffffff;
  VVar4.value = local_48.value;
  return VVar4;
}

Assistant:

ValuedAction AEMS::OptimalAction(const VNode* vnode) {
	ValuedAction astar(-1, Globals::NEG_INFTY);
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		const QNode* qnode = vnode->Child(action);
		if (qnode->lower_bound() > astar.value) {
			astar = ValuedAction(action, qnode->lower_bound());
		}
	}
	return astar;
}